

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::OneofTest_ArenaSetAllocatedString_Test::
OneofTest_ArenaSetAllocatedString_Test(OneofTest_ArenaSetAllocatedString_Test *this)

{
  OneofTest_ArenaSetAllocatedString_Test *this_local;
  
  OneofTest::OneofTest(&this->super_OneofTest);
  (this->super_OneofTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OneofTest_ArenaSetAllocatedString_Test_02a04ed8;
  return;
}

Assistant:

TEST_F(OneofTest, ArenaSetAllocatedString) {
  // Check that set_allocated_foo() works for strings.
  Arena arena;
  UNITTEST::TestOneof2* message = Arena::Create<UNITTEST::TestOneof2>(&arena);

  EXPECT_FALSE(message->has_foo_string());
  const std::string kHello("hello");
  message->set_foo_string(kHello);
  EXPECT_TRUE(message->has_foo_string());

  message->set_allocated_foo_string(nullptr);
  EXPECT_FALSE(message->has_foo_string());
  EXPECT_EQ("", message->foo_string());

  message->set_allocated_foo_string(new std::string(kHello));
  EXPECT_TRUE(message->has_foo_string());
  EXPECT_EQ(kHello, message->foo_string());
}